

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O3

void __thiscall
Js::NumberFormatPartsBuilder::InsertPart
          (NumberFormatPartsBuilder *this,UNumberFormatFields field,int start,int end)

{
  UNumberFormatFields UVar1;
  UNumberFormatFields *pUVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ulong uVar6;
  
  if (start < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x917,"(start >= 0)","start >= 0");
    if (!bVar4) goto LAB_00b5c4b2;
    *puVar5 = 0;
  }
  if (end <= start) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x918,"(start < end)","start < end");
    if (!bVar4) goto LAB_00b5c4b2;
    *puVar5 = 0;
  }
  if (this->formattedLength < (uint)end) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x91e,"(ccEnd <= formattedLength)","ccEnd <= formattedLength");
    if (!bVar4) goto LAB_00b5c4b2;
    *puVar5 = 0;
  }
  pUVar2 = (this->fields).ptr;
  uVar6 = (ulong)(uint)start;
  UVar1 = pUVar2[uVar6];
  if (UVar1 != pUVar2[end - 1]) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x925,"(parentStartField == parentEndField)",
                                "parentStartField == parentEndField");
    if (!bVar4) {
LAB_00b5c4b2:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  if ((uint)start < (uint)end) {
    pUVar2 = (this->fields).ptr;
    do {
      if (pUVar2[uVar6] == UVar1) {
        pUVar2[uVar6] = field;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)end != uVar6);
  }
  return;
}

Assistant:

void InsertPart(UNumberFormatFields field, int start, int end)
        {
            AssertOrFailFast(start >= 0);
            AssertOrFailFast(start < end);

            // the asserts above mean the cast to charcount_t is safe
            charcount_t ccStart = static_cast<charcount_t>(start);
            charcount_t ccEnd = static_cast<charcount_t>(end);

            AssertOrFailFast(ccEnd <= formattedLength);

            // Make sure that the part does not overlap/is a strict subset or superset of other fields
            // The part builder could probably be built and tested to handle this structure not being so rigid,
            // but its safer for now to make sure this is true.
            UNumberFormatFields parentStartField = fields[ccStart];
            UNumberFormatFields parentEndField = fields[ccEnd - 1];
            AssertOrFailFast(parentStartField == parentEndField);

            // Actually insert the part now
            // Only overwrite fields in the span that match start and end, since fields that don't match are sub-parts that were already inserted
            for (charcount_t i = ccStart; i < ccEnd; ++i)
            {
                if (fields[i] == parentStartField)
                {
                    fields[i] = field;
                }
            }
        }